

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O1

bool __thiscall soul::Identifier::operator==(Identifier *this,string_view other)

{
  string *psVar1;
  size_t __n;
  int iVar2;
  bool bVar3;
  
  psVar1 = this->name;
  if (psVar1 != (string *)0x0) {
    __n = psVar1->_M_string_length;
    if (__n == other._M_len) {
      if (__n == 0) {
        bVar3 = true;
      }
      else {
        iVar2 = bcmp((psVar1->_M_dataplus)._M_p,other._M_str,__n);
        bVar3 = iVar2 == 0;
      }
    }
    else {
      bVar3 = false;
    }
    return bVar3;
  }
  throwInternalCompilerError("isValid()","operator==",0x28);
}

Assistant:

bool operator== (std::string_view other) const                  { SOUL_ASSERT (isValid()); return *name == other; }